

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O1

TCGLabel * gen_hook_sys(DisasContext_conflict1 *s,uint32_t insn,hook *hk)

{
  TCGContext_conflict1 *s_00;
  TCGLabel *l;
  TCGTemp *ret;
  TCGv_i32 pTVar1;
  TCGv_i64 pTVar2;
  uintptr_t o;
  uintptr_t o_1;
  TCGTemp *local_48;
  TCGTemp *local_40;
  TCGTemp *local_38;
  
  s_00 = s->uc->tcg_ctx;
  l = gen_new_label_aarch64(s_00);
  ret = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
  pTVar1 = tcg_const_i32_aarch64(s_00,insn);
  pTVar2 = tcg_const_i64_aarch64(s_00,(int64_t)hk);
  tcg_gen_op2_aarch64(s_00,INDEX_op_movi_i64,(TCGArg)(s_00->cpu_pc_arm64 + (long)s_00),s->pc_curr);
  local_48 = (TCGTemp *)(s_00->cpu_env + (long)s_00);
  local_40 = (TCGTemp *)(pTVar1 + (long)s_00);
  local_38 = (TCGTemp *)(pTVar2 + (long)s_00);
  tcg_gen_callN_aarch64(s_00,helper_uc_hooksys64_aarch64,ret,3,&local_48);
  tcg_gen_brcondi_i32_aarch64(s_00,TCG_COND_NE,(TCGv_i32)((long)ret - (long)s_00),0,l);
  tcg_temp_free_internal_aarch64(s_00,ret);
  tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(pTVar1 + (long)s_00));
  tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(pTVar2 + (long)s_00));
  return l;
}

Assistant:

static TCGLabel *gen_hook_sys(DisasContext *s, uint32_t insn, struct hook *hk)
{
    uc_engine *uc = s->uc;
    TCGContext *tcg_ctx = uc->tcg_ctx;
    TCGLabel *label = gen_new_label(tcg_ctx);
    TCGv_i32 tcg_skip, tcg_insn;
    TCGv_ptr tcg_hk;

    tcg_skip = tcg_temp_new_i32(tcg_ctx);
    tcg_insn = tcg_const_i32(tcg_ctx, insn);
    tcg_hk = tcg_const_ptr(tcg_ctx, (void*)hk);

    // Sync pc in advance.
    gen_a64_set_pc_im(tcg_ctx, s->pc_curr);

    // Only one hook per instruction for SYS/SYSL/MRS/MSR is allowed.
    // This is intended and may be extended if it's really necessary.
    gen_helper_uc_hooksys64(tcg_ctx, tcg_skip, tcg_ctx->cpu_env, tcg_insn, tcg_hk);

    tcg_gen_brcondi_i32(tcg_ctx, TCG_COND_NE, tcg_skip, 0, label);
    
    tcg_temp_free_i32(tcg_ctx, tcg_skip);
    tcg_temp_free_i32(tcg_ctx, tcg_insn);
    tcg_temp_free_ptr(tcg_ctx, tcg_hk);

    return label;
}